

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O0

void __thiscall gv_visitor::visit(gv_visitor *this,NotLastExpressions *ptr)

{
  Multiple_expressions *second;
  Expr *second_00;
  NotLastExpressions *pNVar1;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  NotLastExpressions *local_18;
  NotLastExpressions *ptr_local;
  gv_visitor *this_local;
  
  local_18 = ptr;
  ptr_local = (NotLastExpressions *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"mnogo expr2",&local_39);
  box(this,ptr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pNVar1 = local_18;
  second = local_18->prev_exprs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"prev",&local_71);
  arrow(this,pNVar1,second,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  (**(local_18->prev_exprs->super_Base)._vptr_Base)(local_18->prev_exprs,this);
  pNVar1 = local_18;
  second_00 = local_18->expr;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"last",&local_99);
  arrow(this,pNVar1,second_00,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  (**(local_18->expr->super_Base)._vptr_Base)(local_18->expr,this);
  return;
}

Assistant:

void gv_visitor::visit(NotLastExpressions* ptr) {
    box(ptr, "mnogo expr2");
    arrow(ptr, ptr->prev_exprs, "prev");
    ptr->prev_exprs->accept(this);
    arrow(ptr, ptr->expr, "last");
    ptr->expr->accept(this);
}